

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O0

double * inform_local_conditional_entropy
                   (int *xs,int *ys,size_t n,int bx,int by,double *ce,inform_error *err)

{
  _Bool _Var1;
  double dVar2;
  ulong uStack_68;
  int z;
  size_t i;
  double m;
  double s;
  inform_dist *xy;
  inform_dist *x;
  double *pdStack_38;
  _Bool allocate_ce;
  double *ce_local;
  int by_local;
  int bx_local;
  size_t n_local;
  int *ys_local;
  int *xs_local;
  
  pdStack_38 = ce;
  ce_local._0_4_ = by;
  ce_local._4_4_ = bx;
  _by_local = n;
  n_local = (size_t)ys;
  ys_local = xs;
  _Var1 = check_arguments(xs,ys,n,bx,by,err);
  if (_Var1) {
    xs_local = (int *)0x0;
  }
  else {
    x._7_1_ = pdStack_38 == (double *)0x0;
    if (((bool)x._7_1_) &&
       (pdStack_38 = (double *)malloc(_by_local << 3), pdStack_38 == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      xs_local = (int *)0x0;
    }
    else {
      xy = (inform_dist *)0x0;
      s = 0.0;
      _Var1 = allocate(ce_local._4_4_,(int)ce_local,&xy,(inform_dist **)&s,err);
      if (_Var1) {
        if ((x._7_1_ & 1) != 0) {
          free(pdStack_38);
        }
        xs_local = (int *)0x0;
      }
      else {
        accumulate(ys_local,(int *)n_local,_by_local,(int)ce_local,xy,(inform_dist *)s);
        for (uStack_68 = 0; uStack_68 < _by_local; uStack_68 = uStack_68 + 1) {
          dVar2 = log2((double)xy->histogram[ys_local[uStack_68]] /
                       (double)*(uint *)(*(long *)s +
                                        (long)(ys_local[uStack_68] * (int)ce_local +
                                              *(int *)(n_local + uStack_68 * 4)) * 4));
          pdStack_38[uStack_68] = dVar2;
        }
        free_all(&xy,(inform_dist **)&s);
        xs_local = (int *)pdStack_38;
      }
    }
  }
  return (double *)xs_local;
}

Assistant:

double *inform_local_conditional_entropy(int const *xs, int const *ys,
    size_t n, int bx, int by, double *ce, inform_error *err)
{
    if (check_arguments(xs, ys, n, bx, by, err)) return NULL;

    bool allocate_ce = (ce == NULL);
    if (allocate_ce)
    {
        ce = malloc(n * sizeof(double));
        if (ce == NULL)
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist *x = NULL, *xy = NULL;
    if (allocate(bx, by, &x, &xy, err))
    {
        if (allocate_ce) free(ce);
        return NULL;
    }

    accumulate(xs, ys, n, by, x, xy);

    double s, m;
    for (size_t i = 0; i < n; ++i)
    {
        int z = xs[i]*by + ys[i];
        s = xy->histogram[z];
        m = x->histogram[xs[i]];
        ce[i] = log2(m/s);
    }

    free_all(&x, &xy);

    return ce;
}